

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbolize.cpp
# Opt level: O1

bool WTF::Symbolize(void *pc,char *out,int out_size)

{
  short *psVar1;
  short *psVar2;
  FileDescriptor fd;
  bool bVar3;
  Elf64_Word EVar4;
  int fd_00;
  int *piVar5;
  short *psVar6;
  ssize_t sVar7;
  size_t sVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  void *pvVar12;
  long lVar13;
  int iVar14;
  void *symbol_offset;
  ulong uVar15;
  char *eol;
  FileDescriptor wrapped_maps_fd;
  uint64_t start_address;
  char *cursor;
  uint64_t end_address;
  LineReader reader;
  char buf [1024];
  FileDescriptor local_510;
  undefined4 uStack_50c;
  FileDescriptor local_504;
  long local_500;
  void *local_4f8;
  void *local_4f0;
  char *local_4e8;
  ulong local_4e0;
  char *local_4d8;
  Elf64_Shdr local_4d0;
  ulong local_490;
  uint64_t local_488;
  void *local_480;
  undefined1 local_478 [64];
  int local_438 [4];
  ushort local_428;
  long local_410;
  Elf64_Half local_3fc;
  
  if (out_size < 0) goto LAB_00106ab4;
  local_4f0 = (void *)0x0;
  if (out_size == 0) {
    return false;
  }
  *out = '\0';
  local_4f8 = pc;
  SafeAppendString("(",out,out_size);
  uVar15 = (long)out_size - 1;
  fd_00 = 0x109604;
  do {
    EVar4 = open("/proc/self/maps",0);
    local_504.fd_ = EVar4;
    if (-1 < (int)EVar4) {
      local_478._8_8_ = local_438;
      local_478._16_4_ = 0x400;
      local_490 = uVar15 & 0xffffffff;
      local_500 = 0;
      iVar11 = 0;
      local_4e8 = out + 1;
      local_4e0 = uVar15;
      local_4d8 = out;
      local_478._0_4_ = EVar4;
      local_478._24_8_ = local_478._8_8_;
      local_478._32_8_ = local_478._8_8_;
      local_478._40_8_ = local_478._8_8_;
      goto LAB_00106647;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  fd_00 = -1;
  pcVar9 = out + 1;
  lVar13 = 0;
  goto LAB_00106852;
LAB_00106647:
  do {
    bVar3 = LineReader::ReadLine((LineReader *)local_478,(char **)&local_4d0,(char **)&local_510);
    if (bVar3) {
      local_4d0._0_8_ =
           GetHex((char *)local_4d0._0_8_,(char *)CONCAT44(uStack_50c,local_510.fd_),
                  (uint64_t *)&local_4f0);
      if (((short *)local_4d0._0_8_ == (short *)CONCAT44(uStack_50c,local_510.fd_)) ||
         ((char)*(short *)local_4d0._0_8_ != '-')) goto LAB_0010673b;
      local_4d0._0_8_ = local_4d0._0_8_ + 1;
      psVar6 = (short *)GetHex((char *)local_4d0._0_8_,(char *)CONCAT44(uStack_50c,local_510.fd_),
                               (uint64_t *)&local_480);
      pvVar12 = local_4f0;
      psVar2 = (short *)CONCAT44(uStack_50c,local_510.fd_);
      local_4d0._0_8_ = psVar6;
      if ((psVar6 == psVar2) || ((char)*psVar6 != ' ')) {
LAB_00106751:
        bVar3 = false;
        fd_00 = -1;
      }
      else {
        psVar1 = (short *)((long)psVar6 + 1);
        bVar3 = true;
        local_4d0._0_8_ = psVar1;
        if ((local_4f0 <= local_4f8) && (local_4f8 < local_480)) {
          lVar13 = 1;
          if (psVar1 < psVar2) {
            do {
              if (*(char *)((long)psVar6 + lVar13) == ' ') break;
              local_4d0._0_8_ = (long)psVar6 + lVar13 + 1;
              lVar13 = lVar13 + 1;
            } while ((long)psVar2 - (long)psVar6 != lVar13);
          }
          if ((lVar13 < 5) || ((short *)((long)psVar6 + lVar13) == psVar2)) goto LAB_00106751;
          if (*(char *)((long)psVar6 + 3) == 'x' && *psVar1 == 0x2d72) {
            local_4d0._0_8_ = (long)psVar6 + lVar13 + 1;
            local_4d0._0_8_ = GetHex((char *)local_4d0._0_8_,(char *)psVar2,&local_488);
            psVar2 = (short *)CONCAT44(uStack_50c,local_510.fd_);
            iVar14 = -1;
            lVar13 = local_500;
            fd_00 = iVar14;
            if (((short *)local_4d0._0_8_ != psVar2) && ((char)*(short *)local_4d0._0_8_ == ' ')) {
              local_4d0._0_8_ = local_4d0._0_8_ + 1;
              if (iVar11 == 0) {
                pvVar12 = (void *)0x0;
              }
              if ((ulong)local_4d0._0_8_ < psVar2) {
                iVar10 = 0;
                do {
                  if ((char)*(short *)local_4d0._0_8_ == ' ') {
                    iVar10 = iVar10 + 1;
                  }
                  else if (1 < iVar10) break;
                  local_4d0._0_8_ = local_4d0._0_8_ + 1;
                } while ((short *)local_4d0._0_8_ != psVar2);
              }
              lVar13 = (long)pvVar12 - local_488;
              if ((short *)local_4d0._0_8_ != psVar2) {
                do {
                  fd_00 = open((char *)local_4d0._0_8_,0);
                  if (-1 < fd_00) goto LAB_00106832;
                  piVar5 = __errno_location();
                } while (*piVar5 == 4);
                strncpy(local_4e8,(char *)local_4d0._0_8_,local_490);
                local_4d8[local_4e0] = '\0';
                fd_00 = iVar14;
              }
            }
LAB_00106832:
            bVar3 = false;
            local_500 = lVar13;
          }
        }
      }
    }
    else {
LAB_0010673b:
      bVar3 = false;
      fd_00 = -1;
    }
    iVar11 = iVar11 + 1;
    out = local_4d8;
    pcVar9 = local_4e8;
    lVar13 = local_500;
    uVar15 = local_4e0;
  } while (bVar3);
LAB_00106852:
  FileDescriptor::~FileDescriptor(&local_504);
  if (fd_00 < 0) {
    if (*pcVar9 == '\0') {
      return false;
    }
    out[uVar15 & 0xffffffff] = '\0';
    SafeAppendString("+0x",out,out_size);
    local_428 = local_428 & 0xff00;
    local_438[0] = 0;
    local_438[1] = 0;
    local_438[2] = 0;
    local_438[3] = 0;
    pcVar9 = itoa_r((long)local_4f8 - lVar13,(char *)local_438,0x11,0x10,0);
    SafeAppendString(pcVar9,out,out_size);
    SafeAppendString(")",out,out_size);
    return true;
  }
  local_510.fd_ = fd_00;
  sVar7 = ReadFromOffset(fd_00,local_438,0x40,0);
  pvVar12 = local_4f0;
  fd.fd_ = local_510.fd_;
  bVar3 = false;
  if ((sVar7 != 0x40) || (bVar3 = false, local_438[0] != 0x464c457f)) goto LAB_00106a96;
  sVar7 = ReadFromOffset(local_510.fd_,local_438,0x40,0);
  if (sVar7 == 0x40) {
    symbol_offset = (void *)0x0;
    if (local_428 == 3) {
      symbol_offset = pvVar12;
    }
    bVar3 = GetSectionHeaderByType(fd.fd_,local_3fc,local_410,2,(Elf64_Shdr *)local_478);
    if (bVar3) {
      sVar7 = ReadFromOffset(fd.fd_,&local_4d0,0x40,
                             (local_478._40_8_ & 0xffffffff) * 0x40 + local_410);
      if (sVar7 == 0x40) {
        bVar3 = FindSymbol((uint64_t)local_4f8,fd.fd_,out,out_size,(uint64_t)symbol_offset,
                           &local_4d0,(Elf64_Shdr *)local_478);
        if (!bVar3) goto LAB_00106952;
        goto LAB_001069c7;
      }
    }
    else {
LAB_00106952:
      bVar3 = GetSectionHeaderByType(fd.fd_,local_3fc,local_410,0xb,(Elf64_Shdr *)local_478);
      if (((bVar3) &&
          (sVar7 = ReadFromOffset(fd.fd_,&local_4d0,0x40,
                                  (local_478._40_8_ & 0xffffffff) * 0x40 + local_410), sVar7 == 0x40
          )) && (bVar3 = FindSymbol((uint64_t)local_4f8,fd.fd_,out,out_size,(uint64_t)symbol_offset,
                                    &local_4d0,(Elf64_Shdr *)local_478), bVar3)) {
LAB_001069c7:
        bVar3 = Demangle(out,(char *)local_438,0x100);
        if (bVar3) {
          sVar8 = strlen((char *)local_438);
          if (sVar8 + 1 <= (ulong)(uint)out_size) {
            if (0xff < sVar8) {
LAB_00106ab4:
              abort();
            }
            memcpy(out,local_438,sVar8 + 1);
          }
        }
        bVar3 = true;
        goto LAB_00106a96;
      }
    }
  }
  bVar3 = false;
LAB_00106a96:
  FileDescriptor::~FileDescriptor(&local_510);
  return bVar3;
}

Assistant:

bool Symbolize(void *pc, char *out, int out_size) {
    SAFE_ASSERT(out_size >= 0);
    return SymbolizeAndDemangle(pc, out, out_size);
}